

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t
extract_attr_string(_internal_exr_context *ctxt,_internal_exr_seq_scratch *scratch,
                   exr_attr_string_t *attrdata,char *aname,char *tname,int32_t attrsz,char *strptr)

{
  exr_result_t eVar1;
  
  eVar1 = (*scratch->sequential_read)(scratch,strptr,(long)attrsz);
  if (eVar1 != 0) {
    eVar1 = (*ctxt->print_error)
                      (ctxt,eVar1,"Unable to read \'%s\' %s data",aname,tname,ctxt->print_error);
    return eVar1;
  }
  strptr[attrsz] = '\0';
  eVar1 = exr_attr_string_init_static_with_length((exr_context_t)ctxt,attrdata,strptr,attrsz);
  return eVar1;
}

Assistant:

static exr_result_t
extract_attr_string (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_string_t*                attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz,
    char*                             strptr)
{
    exr_result_t rv =
        scratch->sequential_read (scratch, (void*) strptr, (uint64_t) attrsz);

    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Unable to read '%s' %s data", aname, tname);

    strptr[attrsz] = '\0';

    return exr_attr_string_init_static_with_length (
        (exr_context_t) ctxt, attrdata, strptr, attrsz);
}